

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

void assert_wait_child(pid_t child_pid)

{
  uint local_14;
  uint local_10;
  int child_stat;
  pid_t waited_pid;
  pid_t child_pid_local;
  
  child_stat = child_pid;
  local_10 = waitpid(child_pid,(int *)&local_14,0);
  printf("Waited pid is %d with status %d\n",(ulong)local_10,(ulong)local_14);
  if (local_10 == 0xffffffff) {
    perror("Failed to wait");
  }
  if (child_stat != local_10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x55,"child_pid == waited_pid");
    abort();
  }
  if ((local_14 & 0x7f) != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x56,"WIFEXITED(child_stat)");
    abort();
  }
  if ('\0' < (char)(((byte)local_14 & 0x7f) + 1) >> 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x57,"!WIFSIGNALED(child_stat)");
    abort();
  }
  if ((int)(local_14 & 0xff00) >> 8 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x58,"0 == WEXITSTATUS(child_stat)");
    abort();
  }
  return;
}

Assistant:

static void assert_wait_child(pid_t child_pid) {
  pid_t waited_pid;
  int child_stat;

  waited_pid = waitpid(child_pid, &child_stat, 0);
  printf("Waited pid is %d with status %d\n", waited_pid, child_stat);
  if (waited_pid == -1) {
    perror("Failed to wait");
  }
  ASSERT(child_pid == waited_pid);
  ASSERT(WIFEXITED(child_stat)); /* Clean exit, not a signal. */
  ASSERT(!WIFSIGNALED(child_stat));
  ASSERT(0 == WEXITSTATUS(child_stat));
}